

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules2.cpp
# Opt level: O0

void opengv::relative_pose::modules::sixpt::fillRow1
               (Matrix<double,_6,_1,_0,_6,_1> *l01,Matrix<double,_6,_1,_0,_6,_1> *l02,
               Matrix<double,_6,_1,_0,_6,_1> *l11,Matrix<double,_6,_1,_0,_6,_1> *l12,
               vector<double,_std::allocator<double>_> *c0,
               vector<double,_std::allocator<double>_> *c1,
               vector<double,_std::allocator<double>_> *c2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  CoeffReturnType pdVar8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *this;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  value_type_conflict1 *in_stack_ffffffffffffdad8;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *in_stack_ffffffffffffdae0;
  
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (in_stack_ffffffffffffdae0,(Index)in_stack_ffffffffffffdad8);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *)
         ((ulong)*pdVar8 ^ 0x8000000000000000);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = (double)this * *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = dVar7;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = dVar2 * dVar3 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar9,auVar315,auVar621);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar622._8_8_ = 0;
  auVar622._0_8_ = auVar9._0_8_;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar1 * dVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar10,auVar316,auVar622);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar623._8_8_ = 0;
  auVar623._0_8_ = auVar9._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *pdVar8;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar11,auVar317,auVar623);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar624._8_8_ = 0;
  auVar624._0_8_ = auVar9._0_8_;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar1 * dVar2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar12,auVar318,auVar624);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar625._8_8_ = 0;
  auVar625._0_8_ = auVar9._0_8_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *pdVar8;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = -(dVar1 * dVar2);
  vfmadd213sd_fma(auVar13,auVar319,auVar625);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar1 * 2.0 * dVar2;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar14,auVar320,auVar626);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = auVar9._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pdVar8;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = -(dVar1 * 2.0 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar15,auVar321,auVar627);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar628._8_8_ = 0;
  auVar628._0_8_ = auVar9._0_8_;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = dVar1 * 2.0 * dVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar16,auVar322,auVar628);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = -dVar1 * dVar2;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = dVar7 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar17,auVar323,auVar629);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar630._8_8_ = 0;
  auVar630._0_8_ = auVar9._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *pdVar8;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar18,auVar324,auVar630);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = auVar9._0_8_;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar1 * dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar19,auVar325,auVar631);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar632._8_8_ = 0;
  auVar632._0_8_ = auVar9._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *pdVar8;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar20,auVar326,auVar632);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar633._8_8_ = 0;
  auVar633._0_8_ = auVar9._0_8_;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar1 * dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar21,auVar327,auVar633);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = dVar1 * 2.0 * dVar2;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar22,auVar328,auVar634);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar635._8_8_ = 0;
  auVar635._0_8_ = auVar9._0_8_;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = dVar1 * 2.0 * dVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar23,auVar329,auVar635);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar636._8_8_ = 0;
  auVar636._0_8_ = auVar9._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *pdVar8;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar24,auVar330,auVar636);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar3;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar1 * -2.0 * dVar2;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = dVar7 * 2.0 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar25,auVar331,auVar637);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = auVar9._0_8_;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = dVar1 * 2.0 * dVar2;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar26,auVar332,auVar638);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar639._8_8_ = 0;
  auVar639._0_8_ = auVar9._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *pdVar8;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar27,auVar333,auVar639);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar1 * dVar2;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = -(dVar7 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar28,auVar334,auVar640);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar641._8_8_ = 0;
  auVar641._0_8_ = auVar9._0_8_;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar1 * dVar2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar29,auVar335,auVar641);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar642._8_8_ = 0;
  auVar642._0_8_ = auVar9._0_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *pdVar8;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar30,auVar336,auVar642);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar643._8_8_ = 0;
  auVar643._0_8_ = auVar9._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *pdVar8;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar31,auVar337,auVar643);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar644._8_8_ = 0;
  auVar644._0_8_ = auVar9._0_8_;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar1 * dVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar32,auVar338,auVar644);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar3;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar1 * -2.0 * dVar2;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = dVar7 * 2.0 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar33,auVar339,auVar645);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar646._8_8_ = 0;
  auVar646._0_8_ = auVar9._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *pdVar8;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = -(dVar1 * 2.0 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar34,auVar340,auVar646);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = auVar9._0_8_;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = dVar1 * 2.0 * dVar2;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar35,auVar341,auVar647);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar3;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar1 * -2.0 * dVar2;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = dVar7 * 2.0 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar36,auVar342,auVar648);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar649._8_8_ = 0;
  auVar649._0_8_ = auVar9._0_8_;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar1 * 2.0 * dVar2;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar37,auVar343,auVar649);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar650._8_8_ = 0;
  auVar650._0_8_ = auVar9._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *pdVar8;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar38,auVar344,auVar650);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar3;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = dVar1 * 2.0 * dVar2;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar39,auVar345,auVar651);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar652._8_8_ = 0;
  auVar652._0_8_ = auVar9._0_8_;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = dVar1 * 2.0 * dVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar40,auVar346,auVar652);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar653._8_8_ = 0;
  auVar653._0_8_ = auVar9._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *pdVar8;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar41,auVar347,auVar653);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar3;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar1 * dVar2;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = -(dVar7 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar42,auVar348,auVar654);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar655._8_8_ = 0;
  auVar655._0_8_ = auVar9._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *pdVar8;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar43,auVar349,auVar655);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = auVar9._0_8_;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = dVar1 * dVar2;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar44,auVar350,auVar656);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar657._8_8_ = 0;
  auVar657._0_8_ = auVar9._0_8_;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar1 * dVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar45,auVar351,auVar657);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar658._8_8_ = 0;
  auVar658._0_8_ = auVar9._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *pdVar8;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = -(dVar1 * dVar2);
  vfmadd213sd_fma(auVar46,auVar352,auVar658);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar3;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar1 * dVar2;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = dVar7 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar47,auVar353,auVar659);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar660._8_8_ = 0;
  auVar660._0_8_ = auVar9._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *pdVar8;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar48,auVar354,auVar660);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar661._8_8_ = 0;
  auVar661._0_8_ = auVar9._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *pdVar8;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar49,auVar355,auVar661);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar662._8_8_ = 0;
  auVar662._0_8_ = auVar9._0_8_;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar1 * dVar2;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar50,auVar356,auVar662);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar663._8_8_ = 0;
  auVar663._0_8_ = auVar9._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *pdVar8;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = -(dVar1 * dVar2);
  vfmadd213sd_fma(auVar51,auVar357,auVar663);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar3;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar1 * 2.0 * dVar2;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar52,auVar358,auVar664);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar665._8_8_ = 0;
  auVar665._0_8_ = auVar9._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *pdVar8;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = -(dVar1 * 2.0 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar53,auVar359,auVar665);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar666._8_8_ = 0;
  auVar666._0_8_ = auVar9._0_8_;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar1 * 2.0 * dVar2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar54,auVar360,auVar666);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar3;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = -dVar1 * dVar2;
  auVar667._8_8_ = 0;
  auVar667._0_8_ = -(dVar7 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar55,auVar361,auVar667);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar668._8_8_ = 0;
  auVar668._0_8_ = auVar9._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *pdVar8;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar56,auVar362,auVar668);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar669._8_8_ = 0;
  auVar669._0_8_ = auVar9._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar1 * dVar2;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar57,auVar363,auVar669);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = auVar9._0_8_;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = dVar1 * dVar2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar58,auVar364,auVar670);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar671._8_8_ = 0;
  auVar671._0_8_ = auVar9._0_8_;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = dVar1 * dVar2;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar59,auVar365,auVar671);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar3;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = dVar1 * 2.0 * dVar2;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar60,auVar366,auVar672);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar673._8_8_ = 0;
  auVar673._0_8_ = auVar9._0_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar1 * 2.0 * dVar2;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar61,auVar367,auVar673);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar674._8_8_ = 0;
  auVar674._0_8_ = auVar9._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *pdVar8;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar62,auVar368,auVar674);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar3;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = dVar1 * -2.0 * dVar2;
  auVar675._8_8_ = 0;
  auVar675._0_8_ = dVar7 * 2.0 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar63,auVar369,auVar675);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar676._8_8_ = 0;
  auVar676._0_8_ = auVar9._0_8_;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar1 * 2.0 * dVar2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar64,auVar370,auVar676);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar677._8_8_ = 0;
  auVar677._0_8_ = auVar9._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *pdVar8;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar65,auVar371,auVar677);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar3;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar1 * dVar2;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = -(dVar7 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar66,auVar372,auVar678);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar679._8_8_ = 0;
  auVar679._0_8_ = auVar9._0_8_;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = dVar1 * dVar2;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar67,auVar373,auVar679);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar680._8_8_ = 0;
  auVar680._0_8_ = auVar9._0_8_;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar1 * dVar2;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar68,auVar374,auVar680);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar681._8_8_ = 0;
  auVar681._0_8_ = auVar9._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *pdVar8;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar69,auVar375,auVar681);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar682._8_8_ = 0;
  auVar682._0_8_ = auVar9._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *pdVar8;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = -(dVar1 * dVar2);
  vfmadd213sd_fma(auVar70,auVar376,auVar682);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar3;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar1 * 2.0 * dVar2;
  auVar683._8_8_ = 0;
  auVar683._0_8_ = dVar7 * 2.0 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar71,auVar377,auVar683);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar684._8_8_ = 0;
  auVar684._0_8_ = auVar9._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *pdVar8;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = -(dVar1 * 2.0 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar72,auVar378,auVar684);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar685._8_8_ = 0;
  auVar685._0_8_ = auVar9._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *pdVar8;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = -(dVar1 * 2.0 * dVar2);
  vfmadd213sd_fma(auVar73,auVar379,auVar685);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar3;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = dVar1 * 2.0 * dVar2;
  auVar686._8_8_ = 0;
  auVar686._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar74,auVar380,auVar686);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar687._8_8_ = 0;
  auVar687._0_8_ = auVar9._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *pdVar8;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = -(dVar1 * 2.0 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar75,auVar381,auVar687);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar688._8_8_ = 0;
  auVar688._0_8_ = auVar9._0_8_;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar1 * 2.0 * dVar2;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar76,auVar382,auVar688);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar3;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar1 * -2.0 * dVar2;
  auVar689._8_8_ = 0;
  auVar689._0_8_ = -(dVar7 * 2.0 * dVar4 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar77,auVar383,auVar689);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar690._8_8_ = 0;
  auVar690._0_8_ = auVar9._0_8_;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar1 * 2.0 * dVar2;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar78,auVar384,auVar690);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar691._8_8_ = 0;
  auVar691._0_8_ = auVar9._0_8_;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar1 * 2.0 * dVar2;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar79,auVar385,auVar691);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar3;
  auVar386._8_8_ = 0;
  auVar386._0_8_ = -dVar1 * dVar2;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = dVar7 * dVar4 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar80,auVar386,auVar692);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar693._8_8_ = 0;
  auVar693._0_8_ = auVar9._0_8_;
  auVar387._8_8_ = 0;
  auVar387._0_8_ = dVar1 * dVar2;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar81,auVar387,auVar693);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar694._8_8_ = 0;
  auVar694._0_8_ = auVar9._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *pdVar8;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar82,auVar388,auVar694);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar695._8_8_ = 0;
  auVar695._0_8_ = auVar9._0_8_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *pdVar8;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = -(dVar1 * dVar2);
  auVar9 = vfmadd213sd_fma(auVar83,auVar389,auVar695);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar696._8_8_ = 0;
  auVar696._0_8_ = auVar9._0_8_;
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar1 * dVar2;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar84,auVar390,auVar696);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar7;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = -dVar1 * dVar2 * dVar3;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = dVar4 * dVar5 * dVar6 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar85,auVar391,auVar697);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar698._8_8_ = 0;
  auVar698._0_8_ = auVar9._0_8_;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = dVar1 * dVar2 * dVar3;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar86,auVar392,auVar698);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar699._8_8_ = 0;
  auVar699._0_8_ = auVar9._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *pdVar8;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar87,auVar393,auVar699);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar700._8_8_ = 0;
  auVar700._0_8_ = auVar9._0_8_;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = dVar1 * dVar2 * dVar3;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar88,auVar394,auVar700);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar701._8_8_ = 0;
  auVar701._0_8_ = auVar9._0_8_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *pdVar8;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar89,auVar395,auVar701);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar702._8_8_ = 0;
  auVar702._0_8_ = auVar9._0_8_;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar1 * dVar2 * dVar3;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar90,auVar396,auVar702);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar703._8_8_ = 0;
  auVar703._0_8_ = auVar9._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *pdVar8;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar91,auVar397,auVar703);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar704._8_8_ = 0;
  auVar704._0_8_ = auVar9._0_8_;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar1 * dVar2 * dVar3;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar92,auVar398,auVar704);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar705._8_8_ = 0;
  auVar705._0_8_ = auVar9._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *pdVar8;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar93,auVar399,auVar705);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar706._8_8_ = 0;
  auVar706._0_8_ = auVar9._0_8_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *pdVar8;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar94,auVar400,auVar706);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar707._8_8_ = 0;
  auVar707._0_8_ = auVar9._0_8_;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = dVar1 * dVar2 * dVar3;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar95,auVar401,auVar707);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar708._8_8_ = 0;
  auVar708._0_8_ = auVar9._0_8_;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = dVar1 * dVar2 * dVar3;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar96,auVar402,auVar708);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar709._8_8_ = 0;
  auVar709._0_8_ = auVar9._0_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *pdVar8;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar97,auVar403,auVar709);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar710._8_8_ = 0;
  auVar710._0_8_ = auVar9._0_8_;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = dVar1 * dVar2 * dVar3;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar98,auVar404,auVar710);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar711._8_8_ = 0;
  auVar711._0_8_ = auVar9._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *pdVar8;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar99,auVar405,auVar711);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar712._8_8_ = 0;
  auVar712._0_8_ = auVar9._0_8_;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar1 * dVar2 * dVar3;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar100,auVar406,auVar712);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar713._8_8_ = 0;
  auVar713._0_8_ = auVar9._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *pdVar8;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar101,auVar407,auVar713);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar714._8_8_ = 0;
  auVar714._0_8_ = auVar9._0_8_;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar1 * dVar2 * dVar3;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar102,auVar408,auVar714);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar715._8_8_ = 0;
  auVar715._0_8_ = auVar9._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *pdVar8;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar103,auVar409,auVar715);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar716._8_8_ = 0;
  auVar716._0_8_ = auVar9._0_8_;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar1 * dVar2 * dVar3;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar104,auVar410,auVar716);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar717._8_8_ = 0;
  auVar717._0_8_ = auVar9._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *pdVar8;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar105,auVar411,auVar717);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar718._8_8_ = 0;
  auVar718._0_8_ = auVar9._0_8_;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = dVar1 * dVar2 * dVar3;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar106,auVar412,auVar718);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar719._8_8_ = 0;
  auVar719._0_8_ = auVar9._0_8_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *pdVar8;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar107,auVar413,auVar719);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar720._8_8_ = 0;
  auVar720._0_8_ = auVar9._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *pdVar8;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar108,auVar414,auVar720);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar721._8_8_ = 0;
  auVar721._0_8_ = auVar9._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *pdVar8;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar109,auVar415,auVar721);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar722._8_8_ = 0;
  auVar722._0_8_ = auVar9._0_8_;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = dVar1;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar110,auVar416,auVar722);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar723._8_8_ = 0;
  auVar723._0_8_ = auVar9._0_8_;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *pdVar8;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar111,auVar417,auVar723);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar724._8_8_ = 0;
  auVar724._0_8_ = auVar9._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *pdVar8;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar112,auVar418,auVar724);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar725._8_8_ = 0;
  auVar725._0_8_ = auVar9._0_8_;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = dVar1;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar113,auVar419,auVar725);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar7;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar726._8_8_ = 0;
  auVar726._0_8_ = -(dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar114,auVar420,auVar726);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar727._8_8_ = 0;
  auVar727._0_8_ = auVar9._0_8_;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar115,auVar421,auVar727);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar728._8_8_ = 0;
  auVar728._0_8_ = auVar9._0_8_;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *pdVar8;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar116,auVar422,auVar728);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar729._8_8_ = 0;
  auVar729._0_8_ = auVar9._0_8_;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar117,auVar423,auVar729);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar730._8_8_ = 0;
  auVar730._0_8_ = auVar9._0_8_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *pdVar8;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar118,auVar424,auVar730);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar731._8_8_ = 0;
  auVar731._0_8_ = auVar9._0_8_;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar119,auVar425,auVar731);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar732._8_8_ = 0;
  auVar732._0_8_ = auVar9._0_8_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *pdVar8;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar120,auVar426,auVar732);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar733._8_8_ = 0;
  auVar733._0_8_ = auVar9._0_8_;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar121,auVar427,auVar733);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar734._8_8_ = 0;
  auVar734._0_8_ = auVar9._0_8_;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *pdVar8;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar122,auVar428,auVar734);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar735._8_8_ = 0;
  auVar735._0_8_ = auVar9._0_8_;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar123,auVar429,auVar735);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar736._8_8_ = 0;
  auVar736._0_8_ = auVar9._0_8_;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = *pdVar8;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar124,auVar430,auVar736);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar737._8_8_ = 0;
  auVar737._0_8_ = auVar9._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = *pdVar8;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar125,auVar431,auVar737);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar738._8_8_ = 0;
  auVar738._0_8_ = auVar9._0_8_;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar126,auVar432,auVar738);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar739._8_8_ = 0;
  auVar739._0_8_ = auVar9._0_8_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *pdVar8;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar127,auVar433,auVar739);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar740._8_8_ = 0;
  auVar740._0_8_ = auVar9._0_8_;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar128,auVar434,auVar740);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = auVar9._0_8_;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = dVar1 * 2.0;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar129,auVar435,auVar741);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar742._8_8_ = 0;
  auVar742._0_8_ = auVar9._0_8_;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = dVar1 * 2.0;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar130,auVar436,auVar742);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar743._8_8_ = 0;
  auVar743._0_8_ = auVar9._0_8_;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = dVar1 * 2.0;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar131,auVar437,auVar743);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar744._8_8_ = 0;
  auVar744._0_8_ = auVar9._0_8_;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = dVar1 * 2.0;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar132,auVar438,auVar744);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar7;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = dVar1 * dVar2 * dVar3;
  auVar745._8_8_ = 0;
  auVar745._0_8_ = -(dVar4 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar133,auVar439,auVar745);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar746._8_8_ = 0;
  auVar746._0_8_ = auVar9._0_8_;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar1 * dVar2 * dVar3;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar134,auVar440,auVar746);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar747._8_8_ = 0;
  auVar747._0_8_ = auVar9._0_8_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *pdVar8;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar135,auVar441,auVar747);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar748._8_8_ = 0;
  auVar748._0_8_ = auVar9._0_8_;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = *pdVar8;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar136,auVar442,auVar748);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar749._8_8_ = 0;
  auVar749._0_8_ = auVar9._0_8_;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = dVar1 * dVar2 * dVar3;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar137,auVar443,auVar749);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar750._8_8_ = 0;
  auVar750._0_8_ = auVar9._0_8_;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = dVar1 * dVar2 * dVar3;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar138,auVar444,auVar750);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar751._8_8_ = 0;
  auVar751._0_8_ = auVar9._0_8_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *pdVar8;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar139,auVar445,auVar751);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar752._8_8_ = 0;
  auVar752._0_8_ = auVar9._0_8_;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = dVar1 * dVar2 * dVar3;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar140,auVar446,auVar752);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar753._8_8_ = 0;
  auVar753._0_8_ = auVar9._0_8_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *pdVar8;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar141,auVar447,auVar753);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar754._8_8_ = 0;
  auVar754._0_8_ = auVar9._0_8_;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = dVar1 * dVar2 * dVar3;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar142,auVar448,auVar754);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar755._8_8_ = 0;
  auVar755._0_8_ = auVar9._0_8_;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *pdVar8;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar143,auVar449,auVar755);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar756._8_8_ = 0;
  auVar756._0_8_ = auVar9._0_8_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *pdVar8;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar144,auVar450,auVar756);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar757._8_8_ = 0;
  auVar757._0_8_ = auVar9._0_8_;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = dVar1 * dVar2 * dVar3;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar145,auVar451,auVar757);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar758._8_8_ = 0;
  auVar758._0_8_ = auVar9._0_8_;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = *pdVar8;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar146,auVar452,auVar758);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar759._8_8_ = 0;
  auVar759._0_8_ = auVar9._0_8_;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = dVar1 * dVar2 * dVar3;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar147,auVar453,auVar759);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar760._8_8_ = 0;
  auVar760._0_8_ = auVar9._0_8_;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = dVar1 * dVar2 * dVar3;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar148,auVar454,auVar760);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar761._8_8_ = 0;
  auVar761._0_8_ = auVar9._0_8_;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *pdVar8;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar149,auVar455,auVar761);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar762._8_8_ = 0;
  auVar762._0_8_ = auVar9._0_8_;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *pdVar8;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar150,auVar456,auVar762);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar763._8_8_ = 0;
  auVar763._0_8_ = auVar9._0_8_;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = dVar1 * dVar2 * dVar3;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar151,auVar457,auVar763);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar764._8_8_ = 0;
  auVar764._0_8_ = auVar9._0_8_;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = *pdVar8;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar152,auVar458,auVar764);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar765._8_8_ = 0;
  auVar765._0_8_ = auVar9._0_8_;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar1 * dVar2 * dVar3;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar153,auVar459,auVar765);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar766._8_8_ = 0;
  auVar766._0_8_ = auVar9._0_8_;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *pdVar8;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar154,auVar460,auVar766);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar767._8_8_ = 0;
  auVar767._0_8_ = auVar9._0_8_;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar1 * dVar2 * dVar3;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar155,auVar461,auVar767);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar768._8_8_ = 0;
  auVar768._0_8_ = auVar9._0_8_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *pdVar8;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar156,auVar462,auVar768);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar769._8_8_ = 0;
  auVar769._0_8_ = auVar9._0_8_;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = dVar1;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar157,auVar463,auVar769);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar770._8_8_ = 0;
  auVar770._0_8_ = auVar9._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *pdVar8;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar158,auVar464,auVar770);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar771._8_8_ = 0;
  auVar771._0_8_ = auVar9._0_8_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *pdVar8;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar159,auVar465,auVar771);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar772._8_8_ = 0;
  auVar772._0_8_ = auVar9._0_8_;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = dVar1;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar160,auVar466,auVar772);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar773._8_8_ = 0;
  auVar773._0_8_ = auVar9._0_8_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *pdVar8;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = -dVar1;
  vfmadd213sd_fma(auVar161,auVar467,auVar773);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar7;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar774._8_8_ = 0;
  auVar774._0_8_ = -(dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar162,auVar468,auVar774);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar775._8_8_ = 0;
  auVar775._0_8_ = auVar9._0_8_;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar163,auVar469,auVar775);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar776._8_8_ = 0;
  auVar776._0_8_ = auVar9._0_8_;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *pdVar8;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar164,auVar470,auVar776);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar777._8_8_ = 0;
  auVar777._0_8_ = auVar9._0_8_;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar165,auVar471,auVar777);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar778._8_8_ = 0;
  auVar778._0_8_ = auVar9._0_8_;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *pdVar8;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar166,auVar472,auVar778);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar779._8_8_ = 0;
  auVar779._0_8_ = auVar9._0_8_;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar167,auVar473,auVar779);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar780._8_8_ = 0;
  auVar780._0_8_ = auVar9._0_8_;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *pdVar8;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar168,auVar474,auVar780);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar781._8_8_ = 0;
  auVar781._0_8_ = auVar9._0_8_;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *pdVar8;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar169,auVar475,auVar781);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar782._8_8_ = 0;
  auVar782._0_8_ = auVar9._0_8_;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar170,auVar476,auVar782);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar783._8_8_ = 0;
  auVar783._0_8_ = auVar9._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *pdVar8;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar171,auVar477,auVar783);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar784._8_8_ = 0;
  auVar784._0_8_ = auVar9._0_8_;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar172,auVar478,auVar784);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar785._8_8_ = 0;
  auVar785._0_8_ = auVar9._0_8_;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *pdVar8;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar173,auVar479,auVar785);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar786._8_8_ = 0;
  auVar786._0_8_ = auVar9._0_8_;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar174,auVar480,auVar786);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar787._8_8_ = 0;
  auVar787._0_8_ = auVar9._0_8_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *pdVar8;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar175,auVar481,auVar787);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar788._8_8_ = 0;
  auVar788._0_8_ = auVar9._0_8_;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar176,auVar482,auVar788);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar789._8_8_ = 0;
  auVar789._0_8_ = auVar9._0_8_;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = dVar1 * 2.0;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar177,auVar483,auVar789);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar790._8_8_ = 0;
  auVar790._0_8_ = auVar9._0_8_;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = dVar1 * 2.0;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar178,auVar484,auVar790);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar791._8_8_ = 0;
  auVar791._0_8_ = auVar9._0_8_;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = dVar1 * 2.0;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar179,auVar485,auVar791);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar792._8_8_ = 0;
  auVar792._0_8_ = auVar9._0_8_;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar1 * 2.0;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar180,auVar486,auVar792);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar7;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar793._8_8_ = 0;
  auVar793._0_8_ = -(dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar181,auVar487,auVar793);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar794._8_8_ = 0;
  auVar794._0_8_ = auVar9._0_8_;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar182,auVar488,auVar794);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar795._8_8_ = 0;
  auVar795._0_8_ = auVar9._0_8_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *pdVar8;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar183,auVar489,auVar795);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar796._8_8_ = 0;
  auVar796._0_8_ = auVar9._0_8_;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *pdVar8;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar184,auVar490,auVar796);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar797._8_8_ = 0;
  auVar797._0_8_ = auVar9._0_8_;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar185,auVar491,auVar797);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar798._8_8_ = 0;
  auVar798._0_8_ = auVar9._0_8_;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *pdVar8;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar186,auVar492,auVar798);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar799._8_8_ = 0;
  auVar799._0_8_ = auVar9._0_8_;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar187,auVar493,auVar799);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar800._8_8_ = 0;
  auVar800._0_8_ = auVar9._0_8_;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *pdVar8;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar188,auVar494,auVar800);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar801._8_8_ = 0;
  auVar801._0_8_ = auVar9._0_8_;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar189,auVar495,auVar801);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar802._8_8_ = 0;
  auVar802._0_8_ = auVar9._0_8_;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *pdVar8;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar190,auVar496,auVar802);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar803._8_8_ = 0;
  auVar803._0_8_ = auVar9._0_8_;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar191,auVar497,auVar803);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar804._8_8_ = 0;
  auVar804._0_8_ = auVar9._0_8_;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = *pdVar8;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar192,auVar498,auVar804);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar805._8_8_ = 0;
  auVar805._0_8_ = auVar9._0_8_;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar193,auVar499,auVar805);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar806._8_8_ = 0;
  auVar806._0_8_ = auVar9._0_8_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *pdVar8;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar194,auVar500,auVar806);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar807._8_8_ = 0;
  auVar807._0_8_ = auVar9._0_8_;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar195,auVar501,auVar807);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar808._8_8_ = 0;
  auVar808._0_8_ = auVar9._0_8_;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = dVar1 * 2.0;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar196,auVar502,auVar808);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar809._8_8_ = 0;
  auVar809._0_8_ = auVar9._0_8_;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = dVar1 * 2.0;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar197,auVar503,auVar809);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar810._8_8_ = 0;
  auVar810._0_8_ = auVar9._0_8_;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar1 * 2.0;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar198,auVar504,auVar810);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar811._8_8_ = 0;
  auVar811._0_8_ = auVar9._0_8_;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = dVar1 * 2.0;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar199,auVar505,auVar811);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar7;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = -dVar1 * dVar2 * dVar3;
  auVar812._8_8_ = 0;
  auVar812._0_8_ = dVar4 * dVar5 * dVar6 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar200,auVar506,auVar812);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar813._8_8_ = 0;
  auVar813._0_8_ = auVar9._0_8_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *pdVar8;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar201,auVar507,auVar813);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar814._8_8_ = 0;
  auVar814._0_8_ = auVar9._0_8_;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = dVar1 * dVar2 * dVar3;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar202,auVar508,auVar814);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar815._8_8_ = 0;
  auVar815._0_8_ = auVar9._0_8_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = *pdVar8;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar203,auVar509,auVar815);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar816._8_8_ = 0;
  auVar816._0_8_ = auVar9._0_8_;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = dVar1 * dVar2 * dVar3;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar204,auVar510,auVar816);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar817._8_8_ = 0;
  auVar817._0_8_ = auVar9._0_8_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *pdVar8;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar205,auVar511,auVar817);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar818._8_8_ = 0;
  auVar818._0_8_ = auVar9._0_8_;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = dVar1 * dVar2 * dVar3;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar206,auVar512,auVar818);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar819._8_8_ = 0;
  auVar819._0_8_ = auVar9._0_8_;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *pdVar8;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar207,auVar513,auVar819);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar820._8_8_ = 0;
  auVar820._0_8_ = auVar9._0_8_;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = dVar1 * dVar2 * dVar3;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar208,auVar514,auVar820);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar821._8_8_ = 0;
  auVar821._0_8_ = auVar9._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *pdVar8;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar209,auVar515,auVar821);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar822._8_8_ = 0;
  auVar822._0_8_ = auVar9._0_8_;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = dVar1 * dVar2 * dVar3;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar210,auVar516,auVar822);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar823._8_8_ = 0;
  auVar823._0_8_ = auVar9._0_8_;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = *pdVar8;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar211,auVar517,auVar823);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar824._8_8_ = 0;
  auVar824._0_8_ = auVar9._0_8_;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar1 * dVar2 * dVar3;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar212,auVar518,auVar824);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar825._8_8_ = 0;
  auVar825._0_8_ = auVar9._0_8_;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = dVar1 * dVar2 * dVar3;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar213,auVar519,auVar825);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar826._8_8_ = 0;
  auVar826._0_8_ = auVar9._0_8_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *pdVar8;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar214,auVar520,auVar826);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar827._8_8_ = 0;
  auVar827._0_8_ = auVar9._0_8_;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *pdVar8;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar215,auVar521,auVar827);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar828._8_8_ = 0;
  auVar828._0_8_ = auVar9._0_8_;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = dVar1 * dVar2 * dVar3;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar216,auVar522,auVar828);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar829._8_8_ = 0;
  auVar829._0_8_ = auVar9._0_8_;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *pdVar8;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar217,auVar523,auVar829);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar830._8_8_ = 0;
  auVar830._0_8_ = auVar9._0_8_;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = dVar1 * dVar2 * dVar3;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar218,auVar524,auVar830);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar831._8_8_ = 0;
  auVar831._0_8_ = auVar9._0_8_;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = dVar1 * dVar2 * dVar3;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar219,auVar525,auVar831);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar832._8_8_ = 0;
  auVar832._0_8_ = auVar9._0_8_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *pdVar8;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar220,auVar526,auVar832);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar833._8_8_ = 0;
  auVar833._0_8_ = auVar9._0_8_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *pdVar8;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar221,auVar527,auVar833);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar834._8_8_ = 0;
  auVar834._0_8_ = auVar9._0_8_;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = dVar1 * dVar2 * dVar3;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar222,auVar528,auVar834);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar835._8_8_ = 0;
  auVar835._0_8_ = auVar9._0_8_;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = dVar1;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar223,auVar529,auVar835);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar836._8_8_ = 0;
  auVar836._0_8_ = auVar9._0_8_;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *pdVar8;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar224,auVar530,auVar836);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar837._8_8_ = 0;
  auVar837._0_8_ = auVar9._0_8_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *pdVar8;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar225,auVar531,auVar837);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar838._8_8_ = 0;
  auVar838._0_8_ = auVar9._0_8_;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = dVar1;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar226,auVar532,auVar838);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar839._8_8_ = 0;
  auVar839._0_8_ = auVar9._0_8_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *pdVar8;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = -dVar1;
  auVar9 = vfmadd213sd_fma(auVar227,auVar533,auVar839);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar840._8_8_ = 0;
  auVar840._0_8_ = auVar9._0_8_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *pdVar8;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = -dVar1;
  vfmadd213sd_fma(auVar228,auVar534,auVar840);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar7;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = dVar1 * -2.0 * dVar2 * dVar3;
  auVar841._8_8_ = 0;
  auVar841._0_8_ = dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar229,auVar535,auVar841);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar842._8_8_ = 0;
  auVar842._0_8_ = auVar9._0_8_;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar230,auVar536,auVar842);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar843._8_8_ = 0;
  auVar843._0_8_ = auVar9._0_8_;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = *pdVar8;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar231,auVar537,auVar843);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar844._8_8_ = 0;
  auVar844._0_8_ = auVar9._0_8_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *pdVar8;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar232,auVar538,auVar844);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar845._8_8_ = 0;
  auVar845._0_8_ = auVar9._0_8_;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar233,auVar539,auVar845);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar846._8_8_ = 0;
  auVar846._0_8_ = auVar9._0_8_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *pdVar8;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar234,auVar540,auVar846);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar847._8_8_ = 0;
  auVar847._0_8_ = auVar9._0_8_;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar235,auVar541,auVar847);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar848._8_8_ = 0;
  auVar848._0_8_ = auVar9._0_8_;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar236,auVar542,auVar848);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar849._8_8_ = 0;
  auVar849._0_8_ = auVar9._0_8_;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *pdVar8;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar237,auVar543,auVar849);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar850._8_8_ = 0;
  auVar850._0_8_ = auVar9._0_8_;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar238,auVar544,auVar850);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar851._8_8_ = 0;
  auVar851._0_8_ = auVar9._0_8_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *pdVar8;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar239,auVar545,auVar851);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar852._8_8_ = 0;
  auVar852._0_8_ = auVar9._0_8_;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar240,auVar546,auVar852);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar853._8_8_ = 0;
  auVar853._0_8_ = auVar9._0_8_;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *pdVar8;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar241,auVar547,auVar853);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar854._8_8_ = 0;
  auVar854._0_8_ = auVar9._0_8_;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = *pdVar8;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar242,auVar548,auVar854);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar855._8_8_ = 0;
  auVar855._0_8_ = auVar9._0_8_;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar243,auVar549,auVar855);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar856._8_8_ = 0;
  auVar856._0_8_ = auVar9._0_8_;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = dVar1 * 2.0;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar244,auVar550,auVar856);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar857._8_8_ = 0;
  auVar857._0_8_ = auVar9._0_8_;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = *pdVar8;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = -(dVar1 * 2.0);
  auVar9 = vfmadd213sd_fma(auVar245,auVar551,auVar857);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar858._8_8_ = 0;
  auVar858._0_8_ = auVar9._0_8_;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = dVar1 * 2.0;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar246,auVar552,auVar858);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar859._8_8_ = 0;
  auVar859._0_8_ = auVar9._0_8_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = *pdVar8;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = -(dVar1 * 2.0);
  vfmadd213sd_fma(auVar247,auVar553,auVar859);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar7;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = -(dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar248,auVar554,auVar860);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar861._8_8_ = 0;
  auVar861._0_8_ = auVar9._0_8_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = *pdVar8;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar249,auVar555,auVar861);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar862._8_8_ = 0;
  auVar862._0_8_ = auVar9._0_8_;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar250,auVar556,auVar862);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar863._8_8_ = 0;
  auVar863._0_8_ = auVar9._0_8_;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = *pdVar8;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar251,auVar557,auVar863);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar864._8_8_ = 0;
  auVar864._0_8_ = auVar9._0_8_;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar252,auVar558,auVar864);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar865._8_8_ = 0;
  auVar865._0_8_ = auVar9._0_8_;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar253,auVar559,auVar865);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar866._8_8_ = 0;
  auVar866._0_8_ = auVar9._0_8_;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *pdVar8;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar254,auVar560,auVar866);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar867._8_8_ = 0;
  auVar867._0_8_ = auVar9._0_8_;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar255,auVar561,auVar867);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar868._8_8_ = 0;
  auVar868._0_8_ = auVar9._0_8_;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = *pdVar8;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar256,auVar562,auVar868);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar869._8_8_ = 0;
  auVar869._0_8_ = auVar9._0_8_;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *pdVar8;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar257,auVar563,auVar869);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar870._8_8_ = 0;
  auVar870._0_8_ = auVar9._0_8_;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar258,auVar564,auVar870);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar871._8_8_ = 0;
  auVar871._0_8_ = auVar9._0_8_;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar259,auVar565,auVar871);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar872._8_8_ = 0;
  auVar872._0_8_ = auVar9._0_8_;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = *pdVar8;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar260,auVar566,auVar872);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar873._8_8_ = 0;
  auVar873._0_8_ = auVar9._0_8_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *pdVar8;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar261,auVar567,auVar873);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar874._8_8_ = 0;
  auVar874._0_8_ = auVar9._0_8_;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar262,auVar568,auVar874);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar875._8_8_ = 0;
  auVar875._0_8_ = auVar9._0_8_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *pdVar8;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = -(dVar1 * 2.0);
  auVar9 = vfmadd213sd_fma(auVar263,auVar569,auVar875);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar876._8_8_ = 0;
  auVar876._0_8_ = auVar9._0_8_;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar1 * 2.0;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar264,auVar570,auVar876);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar877._8_8_ = 0;
  auVar877._0_8_ = auVar9._0_8_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *pdVar8;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = -(dVar1 * 2.0);
  auVar9 = vfmadd213sd_fma(auVar265,auVar571,auVar877);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar878._8_8_ = 0;
  auVar878._0_8_ = auVar9._0_8_;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = dVar1 * 2.0;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar266,auVar572,auVar878);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar7;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar1 * -2.0 * dVar2 * dVar3;
  auVar879._8_8_ = 0;
  auVar879._0_8_ = dVar4 * 2.0 * dVar5 * dVar6 * *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar267,auVar573,auVar879);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar880._8_8_ = 0;
  auVar880._0_8_ = auVar9._0_8_;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar268,auVar574,auVar880);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar881._8_8_ = 0;
  auVar881._0_8_ = auVar9._0_8_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *pdVar8;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar269,auVar575,auVar881);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar882._8_8_ = 0;
  auVar882._0_8_ = auVar9._0_8_;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar270,auVar576,auVar882);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar883._8_8_ = 0;
  auVar883._0_8_ = auVar9._0_8_;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *pdVar8;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar271,auVar577,auVar883);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar884._8_8_ = 0;
  auVar884._0_8_ = auVar9._0_8_;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *pdVar8;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar272,auVar578,auVar884);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar885._8_8_ = 0;
  auVar885._0_8_ = auVar9._0_8_;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar273,auVar579,auVar885);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar886._8_8_ = 0;
  auVar886._0_8_ = auVar9._0_8_;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar274,auVar580,auVar886);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar887._8_8_ = 0;
  auVar887._0_8_ = auVar9._0_8_;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = *pdVar8;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar275,auVar581,auVar887);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar888._8_8_ = 0;
  auVar888._0_8_ = auVar9._0_8_;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = *pdVar8;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar276,auVar582,auVar888);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar889._8_8_ = 0;
  auVar889._0_8_ = auVar9._0_8_;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar277,auVar583,auVar889);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar890._8_8_ = 0;
  auVar890._0_8_ = auVar9._0_8_;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = *pdVar8;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar278,auVar584,auVar890);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar891._8_8_ = 0;
  auVar891._0_8_ = auVar9._0_8_;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar279,auVar585,auVar891);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar892._8_8_ = 0;
  auVar892._0_8_ = auVar9._0_8_;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = dVar1 * 2.0 * dVar2 * dVar3;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar280,auVar586,auVar892);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar893._8_8_ = 0;
  auVar893._0_8_ = auVar9._0_8_;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *pdVar8;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = -(dVar1 * 2.0 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar281,auVar587,auVar893);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar894._8_8_ = 0;
  auVar894._0_8_ = auVar9._0_8_;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = dVar1 * 2.0;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar282,auVar588,auVar894);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar895._8_8_ = 0;
  auVar895._0_8_ = auVar9._0_8_;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = *pdVar8;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = -(dVar1 * 2.0);
  auVar9 = vfmadd213sd_fma(auVar283,auVar589,auVar895);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar896._8_8_ = 0;
  auVar896._0_8_ = auVar9._0_8_;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = dVar1 * 2.0;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar284,auVar590,auVar896);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar897._8_8_ = 0;
  auVar897._0_8_ = auVar9._0_8_;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = *pdVar8;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = -(dVar1 * 2.0);
  vfmadd213sd_fma(auVar285,auVar591,auVar897);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar7 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar4 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar5 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar6 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar7;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar1 * dVar2 * dVar3;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = -(dVar4 * dVar5 * dVar6 * *pdVar8);
  auVar9 = vfmadd213sd_fma(auVar286,auVar592,auVar898);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar899._8_8_ = 0;
  auVar899._0_8_ = auVar9._0_8_;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = *pdVar8;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar287,auVar593,auVar899);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar900._8_8_ = 0;
  auVar900._0_8_ = auVar9._0_8_;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar1 * dVar2 * dVar3;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar288,auVar594,auVar900);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar901._8_8_ = 0;
  auVar901._0_8_ = auVar9._0_8_;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar1 * dVar2 * dVar3;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar289,auVar595,auVar901);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar902._8_8_ = 0;
  auVar902._0_8_ = auVar9._0_8_;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *pdVar8;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar290,auVar596,auVar902);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar903._8_8_ = 0;
  auVar903._0_8_ = auVar9._0_8_;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = *pdVar8;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar291,auVar597,auVar903);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar904._8_8_ = 0;
  auVar904._0_8_ = auVar9._0_8_;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = dVar1 * dVar2 * dVar3;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar292,auVar598,auVar904);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar905._8_8_ = 0;
  auVar905._0_8_ = auVar9._0_8_;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = *pdVar8;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar293,auVar599,auVar905);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar906._8_8_ = 0;
  auVar906._0_8_ = auVar9._0_8_;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar1 * dVar2 * dVar3;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar294,auVar600,auVar906);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar907._8_8_ = 0;
  auVar907._0_8_ = auVar9._0_8_;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dVar1 * dVar2 * dVar3;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar295,auVar601,auVar907);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar908._8_8_ = 0;
  auVar908._0_8_ = auVar9._0_8_;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = *pdVar8;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar296,auVar602,auVar908);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar909._8_8_ = 0;
  auVar909._0_8_ = auVar9._0_8_;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar1 * dVar2 * dVar3;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar297,auVar603,auVar909);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar910._8_8_ = 0;
  auVar910._0_8_ = auVar9._0_8_;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = *pdVar8;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar298,auVar604,auVar910);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar911._8_8_ = 0;
  auVar911._0_8_ = auVar9._0_8_;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = *pdVar8;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar299,auVar605,auVar911);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar912._8_8_ = 0;
  auVar912._0_8_ = auVar9._0_8_;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dVar1 * dVar2 * dVar3;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar300,auVar606,auVar912);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar913._8_8_ = 0;
  auVar913._0_8_ = auVar9._0_8_;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = *pdVar8;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar301,auVar607,auVar913);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar914._8_8_ = 0;
  auVar914._0_8_ = auVar9._0_8_;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = dVar1 * dVar2 * dVar3;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar302,auVar608,auVar914);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar915._8_8_ = 0;
  auVar915._0_8_ = auVar9._0_8_;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dVar1 * dVar2 * dVar3;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar303,auVar609,auVar915);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar916._8_8_ = 0;
  auVar916._0_8_ = auVar9._0_8_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *pdVar8;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar304,auVar610,auVar916);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar917._8_8_ = 0;
  auVar917._0_8_ = auVar9._0_8_;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = *pdVar8;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar305,auVar611,auVar917);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar918._8_8_ = 0;
  auVar918._0_8_ = auVar9._0_8_;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = dVar1 * dVar2 * dVar3;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar306,auVar612,auVar918);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar919._8_8_ = 0;
  auVar919._0_8_ = auVar9._0_8_;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = dVar1 * dVar2 * dVar3;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar307,auVar613,auVar919);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar2 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar3 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar920._8_8_ = 0;
  auVar920._0_8_ = auVar9._0_8_;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = *pdVar8;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = -(dVar1 * dVar2 * dVar3);
  auVar9 = vfmadd213sd_fma(auVar308,auVar614,auVar920);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar921._8_8_ = 0;
  auVar921._0_8_ = auVar9._0_8_;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = dVar1;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar309,auVar615,auVar921);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar922._8_8_ = 0;
  auVar922._0_8_ = auVar9._0_8_;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar1;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar310,auVar616,auVar922);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar923._8_8_ = 0;
  auVar923._0_8_ = auVar9._0_8_;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = dVar1;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar311,auVar617,auVar923);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar924._8_8_ = 0;
  auVar924._0_8_ = auVar9._0_8_;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = dVar1;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar312,auVar618,auVar924);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar925._8_8_ = 0;
  auVar925._0_8_ = auVar9._0_8_;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = dVar1;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = *pdVar8;
  auVar9 = vfmadd213sd_fma(auVar313,auVar619,auVar925);
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  dVar1 = *pdVar8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                     (this,(Index)in_stack_ffffffffffffdad8);
  auVar926._8_8_ = 0;
  auVar926._0_8_ = auVar9._0_8_;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = dVar1;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = *pdVar8;
  vfmadd213sd_fma(auVar314,auVar620,auVar926);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)this,in_stack_ffffffffffffdad8);
  return;
}

Assistant:

void
opengv::relative_pose::modules::sixpt::fillRow1(
    const Eigen::Matrix<double,6,1> & l01,
    const Eigen::Matrix<double,6,1> & l02,
    const Eigen::Matrix<double,6,1> & l11,
    const Eigen::Matrix<double,6,1> & l12,
    std::vector<double> & c0,
    std::vector<double> & c1,
    std::vector<double> & c2 )
{
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]-2*l12[0]*l11[2]*l01[0]+2*l12[0]*l11[0]*l01[2]);
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[2]*l11[2]*l01[1]-2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]+2*l12[1]*l11[1]*l01[0]-2*l12[1]*l11[0]*l01[1]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]-2*l12[1]*l11[1]*l01[0]+2*l12[1]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[1]+2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]+2*l12[0]*l11[2]*l01[0]-2*l12[0]*l11[0]*l01[2]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c1.push_back(l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]-2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]+2*l12[1]*l11[0]*l02[0]-2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]+2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]-2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]-2*l12[1]*l11[0]*l02[0]+2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]+2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]-l12[4]*l11[1]+l12[3]*l11[0]-l12[2]*l11[5]-l12[1]*l11[4]+l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[1]*l02[5]*l02[0]-2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]+2*l12[1]*l11[1]*l02[4]*l02[0]-2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]+2*l12[0]*l11[2]*l01[5]*l01[1]-2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]-2*l12[0]*l11[0]*l01[4]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]+2*l12[3]*l11[1]+2*l12[1]*l11[3]+2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]+l12[4]*l11[1]-l12[3]*l11[0]-l12[2]*l11[5]+l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[0]-2*l12[2]*l11[2]*l01[3]*l01[2]+2*l12[2]*l11[1]*l01[4]*l01[0]-2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]-2*l12[1]*l11[0]*l02[5]*l02[1]+2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[5]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]+2*l12[5]*l11[0]+2*l12[3]*l11[2]+2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[1]-2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]-2*l12[1]*l11[1]*l01[5]*l01[1]+2*l12[1]*l11[1]*l01[4]*l01[2]-2*l12[1]*l11[0]*l01[5]*l01[0]+2*l12[1]*l11[0]*l01[3]*l01[2]-2*l12[0]*l11[2]*l02[4]*l02[0]+2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]+2*l12[4]*l11[2]+2*l12[2]*l11[4]+2*l12[1]*l11[5]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]-l12[4]*l11[1]-l12[3]*l11[0]+l12[2]*l11[5]-l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(-2*l12[2]*l11[2]*l02[5]*l02[1]+2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]+2*l12[1]*l11[1]*l01[5]*l01[1]-2*l12[1]*l11[1]*l01[4]*l01[2]+2*l12[1]*l11[0]*l01[5]*l01[0]-2*l12[1]*l11[0]*l01[3]*l01[2]+2*l12[0]*l11[2]*l02[4]*l02[0]-2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]-2*l12[4]*l11[2]+2*l12[2]*l11[4]-2*l12[1]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]-2*l12[2]*l11[2]*l01[5]*l01[0]+2*l12[2]*l11[2]*l01[3]*l01[2]-2*l12[2]*l11[1]*l01[4]*l01[0]+2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]+2*l12[1]*l11[0]*l02[5]*l02[1]-2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]+2*l12[0]*l11[0]*l02[5]*l02[0]-2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]-2*l12[5]*l11[0]+2*l12[3]*l11[2]-2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(-2*l12[2]*l11[1]*l02[5]*l02[0]+2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]-2*l12[1]*l11[1]*l02[4]*l02[0]+2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]-2*l12[0]*l11[2]*l01[5]*l01[1]+2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]+2*l12[0]*l11[0]*l01[4]*l01[0]-2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]-2*l12[3]*l11[1]+2*l12[1]*l11[3]-2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]+l12[4]*l11[1]+l12[3]*l11[0]+l12[2]*l11[5]+l12[1]*l11[4]+l12[0]*l11[3]);
}